

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O2

nng_err nni_http_chunks_parse(nni_http_chunks *cl,void *buf,size_t n,size_t *lenp)

{
  size_t *psVar1;
  char *__src;
  char cVar2;
  ushort uVar3;
  chunk_state cVar4;
  void *pvVar5;
  size_t sVar6;
  ushort **ppuVar7;
  long lVar8;
  ulong __n;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong __n_00;
  
  psVar1 = &cl->cl_size;
  uVar11 = 0;
  do {
    while( true ) {
      cVar4 = cl->cl_state;
      if ((cVar4 == CS_DONE) || (__n_00 = n - uVar11, n < uVar11 || __n_00 == 0)) {
        *lenp = uVar11;
        return (uint)(cVar4 != CS_DONE) << 3;
      }
      __src = (char *)((long)buf + uVar11);
      if (cVar4 != CS_DATA) break;
      pvVar5 = nni_list_last(&cl->cl_chunks);
      if (pvVar5 == (void *)0x0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x10d,"chunk != NULL");
      }
      if (cl->cl_state != CS_DATA) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x10e,"cl->cl_state == CS_DATA");
      }
      uVar9 = *(ulong *)((long)pvVar5 + 0x18);
      if (uVar9 < *(ulong *)((long)pvVar5 + 0x20)) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x10f,"chunk->c_resid <= chunk->c_alloc");
        uVar9 = *(ulong *)((long)pvVar5 + 0x18);
      }
      if (uVar9 < 3) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_chunk.c"
                  ,0x110,"chunk->c_alloc > 2");
        uVar9 = *(ulong *)((long)pvVar5 + 0x18);
      }
      __n = *(ulong *)((long)pvVar5 + 0x20);
      pvVar10 = (void *)((uVar9 - __n) + *(long *)((long)pvVar5 + 0x28));
      if (__n_00 < __n) {
        memcpy(pvVar10,__src,__n_00);
        *(long *)((long)pvVar5 + 0x20) = *(long *)((long)pvVar5 + 0x20) - __n_00;
        __n = __n_00;
      }
      else {
        memcpy(pvVar10,__src,__n);
        if (*(char *)(*(long *)((long)pvVar5 + 0x28) + *(long *)((long)pvVar5 + 0x10)) != '\r') {
          return NNG_EPROTO;
        }
        if (*(char *)(*(long *)((long)pvVar5 + 0x28) + 1 + *(long *)((long)pvVar5 + 0x10)) != '\n')
        {
          return NNG_EPROTO;
        }
        *(undefined8 *)((long)pvVar5 + 0x20) = 0;
        *psVar1 = 0;
        cl->cl_line = 0;
        cl->cl_state = CS_INIT;
      }
      uVar11 = uVar11 + __n;
    }
    if (CS_TRLRCR < cVar4) {
      return NNG_EPROTO;
    }
    cVar2 = *__src;
    iVar12 = (int)cVar2;
    lVar8 = (long)iVar12;
    switch(cVar4) {
    case CS_INIT:
      ppuVar7 = __ctype_b_loc();
      uVar3 = (*ppuVar7)[lVar8];
      if ((uVar3 & 8) == 0) {
        return NNG_EPROTO;
      }
      cl->cl_state = CS_LEN;
      goto LAB_001322e2;
    case CS_LEN:
      ppuVar7 = __ctype_b_loc();
      uVar3 = (*ppuVar7)[lVar8];
LAB_001322e2:
      if ((uVar3 >> 0xb & 1) == 0) {
        if ((byte)(cVar2 + 0xbfU) < 6) {
          sVar6 = *psVar1;
          uVar13 = iVar12 - 0x37;
        }
        else {
          if (5 < (byte)(cVar2 + 0x9fU)) {
            if (cVar2 == '\r') {
LAB_001322c6:
              cl->cl_state = CS_CR;
            }
            else {
              if (cVar2 != ';') {
LAB_001323ca:
                return NNG_EPROTO;
              }
              cl->cl_state = CS_EXT;
            }
            break;
          }
          sVar6 = *psVar1;
          uVar13 = iVar12 - 0x57;
        }
        *psVar1 = (ulong)uVar13 + sVar6 * 0x10;
      }
      else {
        *psVar1 = (*psVar1 * 0x10 + lVar8) - 0x30;
      }
      break;
    case CS_EXT:
      if (cVar2 != '\r') {
        ppuVar7 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar7 + lVar8 * 2 + 1) & 0x40) == 0) {
          return NNG_EPROTO;
        }
        break;
      }
      goto LAB_001322c6;
    case CS_CR:
      if (cVar2 != '\n') {
        return NNG_EPROTO;
      }
      if (*psVar1 == 0) {
        cl->cl_line = 0;
        cl->cl_state = CS_TRLR;
      }
      else {
        if ((cl->cl_maxsz != 0) &&
           (sVar6 = nni_http_chunks_size(cl), cl->cl_maxsz < sVar6 + cl->cl_size)) {
          return NNG_EMSGSIZE;
        }
        pvVar5 = nni_zalloc(0x30);
        if (pvVar5 == (void *)0x0) {
          return NNG_ENOMEM;
        }
        pvVar10 = nni_alloc(*psVar1 + 2);
        *(void **)((long)pvVar5 + 0x28) = pvVar10;
        if (pvVar10 == (void *)0x0) {
          nni_free(pvVar5,0x30);
          return NNG_ENOMEM;
        }
        cl->cl_state = CS_DATA;
        sVar6 = cl->cl_size;
        *(size_t *)((long)pvVar5 + 0x10) = sVar6;
        lVar8 = sVar6 + 2;
        *(long *)((long)pvVar5 + 0x18) = lVar8;
        *(long *)((long)pvVar5 + 0x20) = lVar8;
        nni_list_append(&cl->cl_chunks,pvVar5);
      }
      break;
    case CS_DATA:
      goto LAB_001323ca;
    case CS_TRLR:
      if (cVar2 == '\r') {
        cl->cl_state = CS_TRLRCR;
      }
      else {
        ppuVar7 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar7 + lVar8 * 2 + 1) & 0x40) == 0) {
          return NNG_EPROTO;
        }
        cl->cl_line = cl->cl_line + 1;
      }
      break;
    case CS_TRLRCR:
      if (cVar2 != '\n') {
        return NNG_EPROTO;
      }
      cVar4 = CS_DONE;
      if (cl->cl_line != 0) {
        cl->cl_line = 0;
        cVar4 = CS_TRLR;
      }
      cl->cl_state = cVar4;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

nng_err
nni_http_chunks_parse(nni_http_chunks *cl, void *buf, size_t n, size_t *lenp)
{
	size_t i   = 0;
	char  *src = buf;

	// Format of this data is <hexdigits> [ ; <ascii> CRLF ]
	// The <ascii> are chunk extensions, and we don't support any.

	while ((cl->cl_state != CS_DONE) && (i < n)) {
		int    rv;
		size_t cnt;
		switch (cl->cl_state) {
		case CS_DONE:
			// Completed parse!
			break;

		case CS_DATA:
			if ((rv = chunk_ingest_data(
			         cl, src + i, n - i, &cnt)) != 0) {
				return (rv);
			}
			i += cnt;
			break;

		default:
			// All others character by character parse through
			// the state machine grinder.
			if ((rv = chunk_ingest_char(cl, src[i])) != 0) {
				return (rv);
			}
			i++;
			break;
		}
	}

	*lenp = i;
	if (cl->cl_state != CS_DONE) {
		return (NNG_EAGAIN);
	}
	return (NNG_OK);
}